

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Gia_Man_t * Gia_ManFOFUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  int iVar11;
  int local_54;
  
  p_00 = Gia_ManStart(p->nObjs * 9);
  pcVar7 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar7;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar10 = 0;
  while ((iVar10 < p->vCis->nSize && (pGVar8 = Gia_ManCi(p,iVar10), pGVar8 != (Gia_Obj_t *)0x0))) {
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar8->Value = uVar2;
    iVar10 = iVar10 + 1;
  }
  iVar11 = 0;
  iVar10 = 0;
  while ((iVar11 < p->nObjs && (pGVar8 = Gia_ManObj(p,iVar11), pGVar8 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      iVar3 = Vec_IntEntry(vMap,iVar10);
      iVar4 = Gia_ManAppendCi(p_00);
      if (iVar3 == 0) {
        iVar4 = 0;
      }
      iVar5 = Vec_IntEntry(vMap,iVar10 + 1);
      iVar3 = Gia_ManAppendCi(p_00);
      if (iVar5 == 0) {
        iVar3 = 0;
      }
      iVar5 = Vec_IntEntry(vMap,iVar10 + 2);
      local_54 = Gia_ManAppendCi(p_00);
      if (iVar5 == 0) {
        local_54 = 0;
      }
      iVar6 = Vec_IntEntry(vMap,iVar10 + 3);
      iVar5 = Gia_ManAppendCi(p_00);
      if (iVar6 == 0) {
        iVar5 = 0;
      }
      uVar1 = *(ulong *)pGVar8;
      if (((uint)uVar1 >> 0x1d & 1) == 0) {
        if ((uVar1 >> 0x3d & 1) == 0) {
          iVar5 = Abc_LitNot(iVar5);
        }
        else {
          iVar3 = Abc_LitNot(iVar3);
        }
      }
      else if ((uVar1 >> 0x3d & 1) == 0) {
        local_54 = Abc_LitNot(local_54);
      }
      else {
        iVar4 = Abc_LitNot(iVar4);
      }
      iVar10 = iVar10 + 4;
      iVar4 = Gia_ManHashMux(p_00,pGVar8[-(*(ulong *)pGVar8 & 0x1fffffff)].Value,iVar3,iVar4);
      iVar3 = Gia_ManHashMux(p_00,pGVar8[-(*(ulong *)pGVar8 & 0x1fffffff)].Value,iVar5,local_54);
      uVar2 = Gia_ManHashMux(p_00,pGVar8[-((ulong)*(uint *)&pGVar8->field_0x4 & 0x1fffffff)].Value,
                             iVar3,iVar4);
      pGVar8->Value = uVar2;
    }
    iVar11 = iVar11 + 1;
  }
  if (iVar10 == vMap->nSize) {
    iVar10 = 0;
    while ((iVar10 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar10), pGVar8 != (Gia_Obj_t *)0x0)))
    {
      iVar11 = Gia_ObjFanin0Copy(pGVar8);
      uVar2 = Gia_ManAppendCo(p_00,iVar11);
      pGVar8->Value = uVar2;
      iVar10 = iVar10 + 1;
    }
    pGVar9 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    iVar10 = pGVar9->vCis->nSize;
    iVar11 = pGVar9->nRegs;
    iVar4 = p->vCis->nSize;
    iVar3 = Gia_ManAndNum(p);
    if (iVar10 - iVar11 != iVar4 + iVar3 * 4) {
      __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x20d,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
    }
    return pGVar9;
  }
  __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x208,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFOFUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl0, iCtrl1, iCtrl2, iCtrl3, iMuxA, iMuxB, iFuncVars = 0;
    pNew = Gia_ManStart( 9 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl0 = Gia_ManAppendCi(pNew);
        else
            iCtrl0 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl1 = Gia_ManAppendCi(pNew);
        else
            iCtrl1 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl2 = Gia_ManAppendCi(pNew);
        else
            iCtrl2 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl3 = Gia_ManAppendCi(pNew);
        else
            iCtrl3 = 0, Gia_ManAppendCi(pNew);

        if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl0 = Abc_LitNot(iCtrl0);
        else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl1 = Abc_LitNot(iCtrl1);
        else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl2 = Abc_LitNot(iCtrl2);
        else //if ( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl3 = Abc_LitNot(iCtrl3);

        iMuxA       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl1, iCtrl0 );
        iMuxB       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl3, iCtrl2 );
        pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin1(pObj)->Value, iMuxB,  iMuxA );
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p) );
    return pNew;
}